

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetReference<Js::PropertyRecord_const*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,DictionaryPropertyDescriptor<int> **value,int *index)

{
  uint uVar1;
  
  uVar1 = FindEntryWithKey<Js::PropertyRecord_const*>(this,key);
  if (-1 < (int)uVar1) {
    *value = (DictionaryPropertyDescriptor<int> *)((ulong)uVar1 * 0x20 + *(long *)(this + 8));
    *index = uVar1;
  }
  return -1 < (int)uVar1;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }